

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_thread.c
# Opt level: O2

ObjThread * newObjThread(VM *vm,ObjClosure *objClosure)

{
  uint32_t uVar1;
  Frame *pFVar2;
  Value *pVVar3;
  ObjThread *objThread;
  
  pFVar2 = (Frame *)memManager(vm,(void *)0x0,0,0x60);
  uVar1 = ceilToPowerOf2(objClosure->fn->maxStackSlotUsedNum + 1);
  pVVar3 = (Value *)memManager(vm,(void *)0x0,0,uVar1 << 4);
  objThread = (ObjThread *)memManager(vm,(void *)0x0,0,0x60);
  initObjHeader(vm,(ObjHeader *)objThread,OT_THREAD,vm->threadClass);
  objThread->frames = pFVar2;
  objThread->frameCapacity = 4;
  objThread->stack = pVVar3;
  objThread->stackCapacity = uVar1;
  resetThread(objThread,objClosure);
  return objThread;
}

Assistant:

ObjThread *newObjThread(VM *vm, ObjClosure *objClosure) {
    ASSERT(objClosure != NULL, "objClosure is NULL!");

    Frame *frames = ALLOCATE_ARRAY(vm, Frame, INITIAL_FRAME_NUM);
    // +1是为了存储接收者, class或者对象
    uint32_t stackCapacity = ceilToPowerOf2(objClosure->fn->maxStackSlotUsedNum + 1);
    Value *newStack = ALLOCATE_ARRAY(vm, Value, stackCapacity);

    ObjThread *objThread = ALLOCATE(vm, ObjThread);
    initObjHeader(vm, &objThread->objHeader, OT_THREAD, vm->threadClass);

    objThread->frames = frames;
    objThread->frameCapacity = INITIAL_FRAME_NUM;
    objThread->stack = newStack;
    objThread->stackCapacity = stackCapacity;

    resetThread(objThread, objClosure);
    return objThread;
}